

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O2

void Ssw_ManCollectPos_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vNewPos)

{
  ulong uVar1;
  Aig_Man_t *p_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  Aig_Obj_t *pObj_00;
  uint uVar6;
  char *__assertion;
  uint uVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Aig_IsComplement(pObj)";
    uVar7 = 0x6b;
LAB_0055f8c3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                  ,uVar7,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
  }
  uVar1 = *(ulong *)&pObj->field_0x18;
  if ((uVar1 & 0x20) == 0) {
    uVar4 = uVar1 | 0x20;
    *(ulong *)&pObj->field_0x18 = uVar4;
    if (pObj->Id <= p->nSRMiterMaxId) {
      if (((uint)uVar1 & 7) == 3) {
        iVar2 = Aig_ObjCioId(pObj);
        if (iVar2 < p->pFrames->nObjs[3] - p->pAig->nRegs) {
          iVar3 = Aig_ObjCioId(pObj);
          iVar2 = vNewPos->nSize;
          if (iVar2 == vNewPos->nCap) {
            uVar7 = 0x10;
            if (0xf < iVar2) {
              uVar7 = iVar2 * 2;
            }
            if (iVar2 < (int)uVar7) {
              if (vNewPos->pArray == (int *)0x0) {
                piVar5 = (int *)malloc((ulong)uVar7 << 2);
              }
              else {
                piVar5 = (int *)realloc(vNewPos->pArray,(ulong)uVar7 << 2);
              }
              vNewPos->pArray = piVar5;
              if (piVar5 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              vNewPos->nCap = uVar7;
              iVar2 = vNewPos->nSize;
            }
          }
          vNewPos->nSize = iVar2 + 1;
          vNewPos->pArray[iVar2] = iVar3 / 2;
        }
      }
      else {
        if (p->pFrames->pFanData == (int *)0x0) {
          __assertion = "p->pFrames->pFanData != NULL";
          uVar7 = 0x7b;
          goto LAB_0055f8c3;
        }
        uVar7 = 0xffffffff;
        for (uVar6 = 0; uVar6 < ((uint)(uVar4 >> 6) & 0x3ffffff); uVar6 = uVar6 + 1) {
          p_00 = p->pFrames;
          if (uVar6 == 0) {
            if (p_00->nFansAlloc <= pObj->Id) {
              __assert_fail("ObjId < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
            }
            iVar2 = pObj->Id * 5;
          }
          else {
            if (p_00->nFansAlloc <= (int)uVar7 / 2) {
              __assert_fail("iFan/2 < p->nFansAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
            }
            iVar2 = ((int)uVar7 >> 1) * 5 + (uVar7 & 1) + 3;
          }
          uVar7 = p_00->pFanData[iVar2];
          pObj_00 = Aig_ManObj(p_00,(int)uVar7 >> 1);
          Ssw_ManCollectPos_rec(p,pObj_00,vNewPos);
          uVar4 = *(ulong *)&pObj->field_0x18;
        }
      }
    }
  }
  return;
}

Assistant:

void Ssw_ManCollectPos_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vNewPos )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( pObj->fMarkB )
        return;
    pObj->fMarkB = 1;
    if ( pObj->Id > p->nSRMiterMaxId )
        return;
    if ( Aig_ObjIsCo(pObj) )
    {
        // skip if it is a register input PO
        if ( Aig_ObjCioId(pObj) >= Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig) )
            return;
        // add the number of this constraint
        Vec_IntPush( vNewPos, Aig_ObjCioId(pObj)/2 );
        return;
    }
    // visit the fanouts
    assert( p->pFrames->pFanData != NULL );
    Aig_ObjForEachFanout( p->pFrames, pObj, pFanout, iFanout, i )
        Ssw_ManCollectPos_rec( p, pFanout, vNewPos );
}